

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

int fy_emit_explicit_document_end(fy_emitter *emit)

{
  int iVar1;
  int iVar2;
  
  iVar1 = fy_emit_common_explicit_document_end(emit);
  iVar2 = -1;
  if (iVar1 == 0) {
    emit->fyd = (fy_document *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int fy_emit_explicit_document_end(struct fy_emitter *emit) {
    int ret;

    ret = fy_emit_common_explicit_document_end(emit);
    if (ret)
        return ret;

    emit->fyd = NULL;
    return 0;
}